

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunLoadStorePropagation(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint *puVar1;
  char **ppcVar2;
  SmallArray<VmValue_*,_4U> *this;
  VmInstructionType VVar3;
  VmInstructionType cmd;
  VariableData *pVVar4;
  VmInstruction *pVVar5;
  VmBlock *this_00;
  VmValue *pVVar6;
  bool bVar7;
  int iVar8;
  VariableData **ppVVar9;
  VmConstant **ppVVar10;
  VmValue **ppVVar11;
  VmInstruction **ppVVar12;
  VmValue *pVVar13;
  VmConstant *pVVar14;
  VmValue *pVVar15;
  VmInstruction *pVVar16;
  VmInstruction *pVVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VmValue *pVVar18;
  VmValue *replacement;
  uint k;
  SmallArray<VmValue_*,_4U> *pSVar19;
  uint l;
  uint uVar20;
  int iVar21;
  VmConstant *this_01;
  uint uVar22;
  SynBase *pSVar23;
  Allocator *allocator;
  VmValue *in_R9;
  VmInstruction *pVVar24;
  uint i;
  VmInstruction *pVVar25;
  uint uVar26;
  VmType type;
  VmType type_00;
  VmInstruction *inst;
  SmallArray<VmInstruction_*,_32U> deadStores;
  
  if (value == (VmValue *)0x0) {
    return;
  }
  if (value->typeID != 3) {
    if (value->typeID != 4) {
      return;
    }
    module->currentFunction = (VmFunction *)value;
    pVVar13 = (VmValue *)value[1].source;
    while (pVVar13 != (VmValue *)0x0) {
      pVVar15 = (VmValue *)pVVar13[1].comment.begin;
      RunLoadStorePropagation(ctx,module,pVVar13);
      pVVar13 = pVVar15;
    }
    uVar22 = 0;
    do {
      if (*(uint *)(value[1].users.little + 2) <= uVar22) {
        module->currentFunction = (VmFunction *)0x0;
        return;
      }
      ppVVar9 = SmallArray<VariableData_*,_4U>::operator[]
                          ((SmallArray<VariableData_*,_4U> *)(value[1].users.little + 1),uVar22);
      pVVar4 = *ppVVar9;
      uVar26 = 0;
      while( true ) {
        uVar20 = (pVVar4->users).count;
        if (uVar20 <= uVar26) break;
        ppVVar10 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar4->users,uVar26);
        pVVar14 = *ppVVar10;
        for (uVar20 = 0; uVar20 < (pVVar14->super_VmValue).users.count; uVar20 = uVar20 + 1) {
          ppVVar11 = SmallArray<VmValue_*,_8U>::operator[](&(pVVar14->super_VmValue).users,uVar20);
          pVVar13 = *ppVVar11;
          if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 2)) {
            __assert_fail("!\"invalid constant use\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x14a8,
                          "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          iVar8 = *(int *)&pVVar13[1]._vptr_VmValue;
          if (iVar8 - 8U < 7) {
            ppVVar11 = SmallArray<VmValue_*,_4U>::operator[]
                                 ((SmallArray<VmValue_*,_4U> *)&pVVar13[1].typeID,0);
            if ((VmConstant *)*ppVVar11 != pVVar14) {
              iVar8 = *(int *)&pVVar13[1]._vptr_VmValue;
              goto LAB_001a1ccd;
            }
          }
          else {
LAB_001a1ccd:
            if (iVar8 == 0x1b) {
              puVar1 = &pVVar13[1].typeID;
              ppVVar11 = SmallArray<VmValue_*,_4U>::operator[]
                                   ((SmallArray<VmValue_*,_4U> *)puVar1,0);
              if ((VmConstant *)*ppVVar11 == pVVar14) goto LAB_001a1d2c;
              iVar8 = *(int *)&pVVar13[1]._vptr_VmValue;
              if (iVar8 == 0x1b) {
                ppVVar11 = SmallArray<VmValue_*,_4U>::operator[]
                                     ((SmallArray<VmValue_*,_4U> *)puVar1,2);
                if ((VmConstant *)*ppVVar11 == pVVar14) {
                  ppVVar11 = SmallArray<VmValue_*,_4U>::operator[]
                                       ((SmallArray<VmValue_*,_4U> *)puVar1,0);
                  pVVar15 = *ppVVar11;
                  if (((pVVar15 != (VmValue *)0x0) && (pVVar15->typeID == 1)) &&
                     ((VariableData *)pVVar15[1].comment.end == pVVar14->container))
                  goto LAB_001a1d2c;
                }
                iVar8 = *(int *)&pVVar13[1]._vptr_VmValue;
              }
            }
            if ((iVar8 != 0x1a) ||
               (ppVVar11 = SmallArray<VmValue_*,_4U>::operator[]
                                     ((SmallArray<VmValue_*,_4U> *)&pVVar13[1].typeID,0),
               (VmConstant *)*ppVVar11 != pVVar14)) goto LAB_001a1e41;
          }
LAB_001a1d2c:
        }
        uVar26 = uVar26 + 1;
      }
      deadStores.allocator = module->allocator;
      deadStores.data = deadStores.little;
      deadStores.count = 0;
      deadStores.max = 0x20;
      for (uVar26 = 0; uVar26 < uVar20; uVar26 = uVar26 + 1) {
        ppVVar10 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar4->users,uVar26);
        pVVar14 = *ppVVar10;
        for (uVar20 = 0; uVar20 < (pVVar14->super_VmValue).users.count; uVar20 = uVar20 + 1) {
          ppVVar11 = SmallArray<VmValue_*,_8U>::operator[](&(pVVar14->super_VmValue).users,uVar20);
          pVVar5 = (VmInstruction *)*ppVVar11;
          if ((pVVar5 != (VmInstruction *)0x0) && ((pVVar5->super_VmValue).typeID == 2)) {
            inst = pVVar5;
            SmallArray<VmInstruction_*,_32U>::push_back(&deadStores,&inst);
          }
        }
        uVar20 = (pVVar4->users).count;
      }
      for (uVar26 = 0; uVar26 < deadStores.count; uVar26 = uVar26 + 1) {
        ppVVar12 = SmallArray<VmInstruction_*,_32U>::operator[](&deadStores,uVar26);
        this_00 = (*ppVVar12)->parent;
        if (this_00 != (VmBlock *)0x0) {
          VmBlock::RemoveInstruction(this_00,*ppVVar12);
        }
        module->loadStorePropagations = module->loadStorePropagations + 1;
      }
      SmallArray<VmInstruction_*,_32U>::~SmallArray(&deadStores);
LAB_001a1e41:
      uVar22 = uVar22 + 1;
    } while( true );
  }
  (module->loadStoreInfo).count = 0;
  ppcVar2 = &value[1].comment.end;
  puVar1 = &module->loadStorePropagations;
  pVVar5 = (VmInstruction *)value[1].comment.end;
switchD_001a1ecb_caseD_7:
  pVVar25 = pVVar5;
  ppVVar12 = (VmInstruction **)ppcVar2;
  if (pVVar25 == (VmInstruction *)0x0) goto LAB_001a28ff;
  pVVar5 = pVVar25->nextSibling;
  switch(pVVar25->cmd) {
  case VM_INST_LOAD_BYTE:
    pVVar13 = anon_unknown.dwarf_11cad6::GetLoadStoreInfo(module,pVVar25);
    if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 1)) {
LAB_001a223d:
      anon_unknown.dwarf_11cad6::AddLoadInfo(module,pVVar25);
      goto switchD_001a1ecb_caseD_7;
    }
    allocator = module->allocator;
    pSVar23 = pVVar13->source;
    iVar8 = (int)*(char *)&pVVar13[1]._vptr_VmValue;
    break;
  case VM_INST_LOAD_SHORT:
    pVVar13 = anon_unknown.dwarf_11cad6::GetLoadStoreInfo(module,pVVar25);
    if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 1)) goto LAB_001a223d;
    allocator = module->allocator;
    pSVar23 = pVVar13->source;
    iVar8 = (int)*(short *)&pVVar13[1]._vptr_VmValue;
    break;
  case VM_INST_LOAD_INT:
  case VM_INST_LOAD_FLOAT:
  case VM_INST_LOAD_DOUBLE:
  case VM_INST_LOAD_LONG:
  case VM_INST_LOAD_STRUCT:
    pVVar14 = (VmConstant *)anon_unknown.dwarf_11cad6::GetLoadStoreInfo(module,pVVar25);
    if (pVVar14 != (VmConstant *)0x0) {
      uVar22 = (pVVar25->super_VmValue).type.size;
      uVar26 = (pVVar14->super_VmValue).type.size;
      if (uVar22 != uVar26 ||
          (pVVar25->super_VmValue).type.type != (pVVar14->super_VmValue).type.type) {
        if (uVar22 != uVar26) {
          __assert_fail("curr->type.size == prevValue->type.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x14f9,
                        "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)");
        }
        module->currentBlock = (VmBlock *)value;
        value[1].users.data = (VmValue **)pVVar25->prevSibling;
        type.structType = (TypeBase *)pVVar14;
        type._0_8_ = (pVVar25->super_VmValue).type.structType;
        pVVar14 = (VmConstant *)
                  anon_unknown.dwarf_11cad6::CreateBitcast
                            ((anon_unknown_dwarf_11cad6 *)module,
                             (VmModule *)(pVVar25->super_VmValue).source,
                             *(SynBase **)&(pVVar25->super_VmValue).type,type,in_R9);
        value[1].users.data = *(VmValue ***)&value[1].hasSideEffects;
        module->currentBlock = (VmBlock *)0x0;
      }
      goto LAB_001a20f6;
    }
    anon_unknown.dwarf_11cad6::AddLoadInfo(module,pVVar25);
  default:
    goto switchD_001a1ecb_caseD_7;
  case VM_INST_STORE_BYTE:
  case VM_INST_STORE_SHORT:
  case VM_INST_STORE_INT:
  case VM_INST_STORE_FLOAT:
  case VM_INST_STORE_DOUBLE:
  case VM_INST_STORE_LONG:
  case VM_INST_STORE_STRUCT:
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar25->arguments,0);
    pVVar17 = (VmInstruction *)*ppVVar11;
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar25->arguments,1);
    pVVar13 = *ppVVar11;
    if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 1)) {
      pVVar13 = (VmValue *)0x0;
    }
    if (pVVar17 == (VmInstruction *)0x0) goto LAB_001a244d;
    uVar22 = (pVVar17->super_VmValue).typeID;
    if (uVar22 == 2) {
      if (pVVar17->cmd == VM_INST_INDEX) {
        pSVar19 = &pVVar17->arguments;
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,0);
        pVVar15 = *ppVVar11;
        if ((pVVar15 == (VmValue *)0x0) || (pVVar15->typeID != 1)) {
          pVVar15 = (VmValue *)0x0;
        }
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,1);
        pVVar6 = *ppVVar11;
        if (((pVVar6 == (VmValue *)0x0) || (pVVar15 == (VmValue *)0x0)) || (pVVar6->typeID != 1)) {
          __assert_fail("length && elemSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x5f4,
                        "void (anonymous namespace)::AddStoreInfo(VmModule *, VmInstruction *)");
        }
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,2);
        pVVar18 = *ppVVar11;
        if ((pVVar18 != (VmValue *)0x0) && (pVVar18->typeID == 1)) {
          iVar8 = *(int *)&pVVar18[1]._vptr_VmValue;
          iVar21 = *(int *)&pVVar6[1]._vptr_VmValue * *(int *)&pVVar15[1]._vptr_VmValue;
          ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,3);
          pVVar15 = *ppVVar11;
          if ((pVVar15 != (VmValue *)0x0) && (pVVar15->typeID == 1)) {
            iVar21 = *(int *)&pVVar6[1]._vptr_VmValue;
            iVar8 = iVar8 + *(int *)&pVVar15[1]._vptr_VmValue * iVar21;
          }
          anon_unknown.dwarf_11cad6::ClearLoadStoreInfo
                    (module,(VariableData *)pVVar18[1].comment.end,
                     iVar8 + *(int *)&pVVar13[1]._vptr_VmValue,
                     iVar21 - *(int *)&pVVar13[1]._vptr_VmValue);
          goto switchD_001a1ecb_caseD_7;
        }
      }
    }
    else if (uVar22 == 1) {
      pVVar15 = (pVVar17->arguments).little[3];
      if (pVVar15 != (VmValue *)0x0) {
        if (*(int *)&pVVar13[1]._vptr_VmValue != 0) {
          __assert_fail("storeOffset->iValue == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x5d1,
                        "void (anonymous namespace)::AddStoreInfo(VmModule *, VmInstruction *)");
        }
        pSVar23 = pVVar15->source;
        if (((pSVar23 == (SynBase *)0x0) || (pSVar23->typeID != 0x13)) ||
           ((long)pSVar23[1].pos.end < 0x21)) {
          deadStores.data = (VmInstruction **)0x0;
          deadStores.little[0] = (VmInstruction *)0x0;
          deadStores.little[6] = (VmInstruction *)0x0;
          deadStores.little[7] = (VmInstruction *)0x0;
          deadStores.little[4] = (VmInstruction *)0x0;
          deadStores.little[5] = (VmInstruction *)0x0;
          deadStores.little[2] = (VmInstruction *)0x0;
          deadStores.little[3] = (VmInstruction *)0x0;
          deadStores._8_8_ = pVVar25;
          deadStores.little[1]._0_4_ = GetAccessSize(pVVar25);
          deadStores.little[5] = pVVar17;
          anon_unknown.dwarf_11cad6::ClearLoadStoreInfo
                    (module,(VariableData *)(pVVar17->arguments).little[3],pVVar17->cmd,
                     (uint)deadStores.little[1]);
          deadStores.little[8]._0_1_ = 1;
          pVVar4 = (VariableData *)(pVVar17->arguments).little[3];
          if (pVVar4 == (VariableData *)0x0) {
            bVar7 = false;
          }
          else {
            bVar7 = HasAddressTaken(pVVar4);
            bVar7 = !bVar7;
          }
          goto LAB_001a2808;
        }
      }
      goto switchD_001a1ecb_caseD_7;
    }
    goto LAB_001a244d;
  case VM_INST_SET_RANGE:
    goto switchD_001a1ecb_caseD_1a;
  case VM_INST_MEM_COPY:
    pSVar19 = &pVVar25->arguments;
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,2);
    pVVar13 = *ppVVar11;
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,3);
    pVVar14 = (VmConstant *)*ppVVar11;
    if ((pVVar14 == (VmConstant *)0x0) || ((pVVar14->super_VmValue).typeID != 1)) {
      pVVar14 = (VmConstant *)0x0;
    }
    uVar22 = GetAccessSize(pVVar25);
    pVVar17 = anon_unknown.dwarf_11cad6::GetCopyInfo(module,pVVar13,pVVar14,uVar22);
    if (pVVar17 != (VmInstruction *)0x0) {
      VVar3 = pVVar25->cmd;
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,0);
      pVVar13 = *ppVVar11;
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,1);
      pVVar15 = *ppVVar11;
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar17->arguments,2);
      in_R9 = *ppVVar11;
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar17->arguments,3);
      pVVar6 = *ppVVar11;
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,4);
      anon_unknown.dwarf_11cad6::ChangeInstructionTo
                (module,pVVar25,VVar3,pVVar13,pVVar15,in_R9,pVVar6,*ppVVar11,puVar1);
    }
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,0);
    pVVar17 = (VmInstruction *)*ppVVar11;
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,1);
    pVVar13 = *ppVVar11;
    if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 1)) {
      pVVar13 = (VmValue *)0x0;
    }
    if ((pVVar17 != (VmInstruction *)0x0) && ((pVVar17->super_VmValue).typeID == 1)) {
      if ((pVVar17->arguments).little[3] != (VmValue *)0x0) {
        if (*(int *)&pVVar13[1]._vptr_VmValue != 0) {
          __assert_fail("storeOffset->iValue == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x617,
                        "void (anonymous namespace)::AddCopyInfo(VmModule *, VmInstruction *)");
        }
        deadStores.data = (VmInstruction **)0x0;
        deadStores.count = 0;
        deadStores.max = 0;
        deadStores.little[6] = (VmInstruction *)0x0;
        deadStores.little[7] = (VmInstruction *)0x0;
        deadStores.little[4] = (VmInstruction *)0x0;
        deadStores.little[5] = (VmInstruction *)0x0;
        deadStores.little[2] = (VmInstruction *)0x0;
        deadStores.little[3] = (VmInstruction *)0x0;
        deadStores.little[8]._0_2_ = 0;
        deadStores.little[0] = pVVar25;
        uVar22 = GetAccessSize(pVVar25);
        deadStores.little[1]._0_4_ = uVar22;
        deadStores.little[5] = pVVar17;
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,2);
        pVVar25 = (VmInstruction *)*ppVVar11;
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,3);
        pVVar16 = (VmInstruction *)*ppVVar11;
        if ((pVVar16 == (VmInstruction *)0x0) || ((pVVar16->super_VmValue).typeID != 1)) {
          pVVar16 = (VmInstruction *)0x0;
        }
        bVar7 = pVVar25 == (VmInstruction *)0x0;
        if ((bVar7) || ((pVVar25->super_VmValue).typeID != 1)) {
          pVVar24 = (VmInstruction *)0x0;
          deadStores.little[3] = pVVar25;
          deadStores.little[4] = pVVar16;
        }
        else {
          if (*(int *)&pVVar13[1]._vptr_VmValue != 0) {
            __assert_fail("storeOffset->iValue == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x627,
                          "void (anonymous namespace)::AddCopyInfo(VmModule *, VmInstruction *)");
          }
          bVar7 = true;
          pVVar24 = pVVar25;
          deadStores.little[2] = pVVar25;
        }
        anon_unknown.dwarf_11cad6::ClearLoadStoreInfo
                  (module,(VariableData *)(pVVar17->arguments).little[3],pVVar17->cmd,uVar22);
        if (pVVar24 != (VmInstruction *)0x0) {
          pVVar4 = (VariableData *)(pVVar24->arguments).little[3];
          if (pVVar4 == (VariableData *)0x0) {
            bVar7 = false;
          }
          else {
            bVar7 = HasAddressTaken(pVVar4);
            bVar7 = !bVar7;
          }
        }
        deadStores.little[8]._0_1_ = bVar7;
        pVVar4 = (VariableData *)(pVVar17->arguments).little[3];
        if (pVVar4 == (VariableData *)0x0) {
          bVar7 = false;
        }
        else {
          bVar7 = HasAddressTaken(pVVar4);
          bVar7 = !bVar7;
        }
LAB_001a2808:
        deadStores.little[8]._1_1_ = bVar7;
        SmallArray<VmModule::LoadStoreInfo,_32U>::push_back
                  (&module->loadStoreInfo,(LoadStoreInfo *)&deadStores);
      }
      goto switchD_001a1ecb_caseD_7;
    }
LAB_001a244d:
    anon_unknown.dwarf_11cad6::ClearLoadStoreInfoAliasing(module,pVVar25);
    goto switchD_001a1ecb_caseD_7;
  case VM_INST_CALL:
    pSVar19 = &pVVar25->arguments;
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,0);
    if (((*ppVVar11)->type).type == VM_TYPE_FUNCTION_REF) {
      uVar22 = 2;
LAB_001a25b5:
      pVVar13 = (VmValue *)0x0;
      uVar26 = uVar22;
    }
    else {
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,1);
      pVVar13 = *ppVVar11;
      if ((pVVar13 == (VmValue *)0x0) || (uVar22 = 3, uVar26 = uVar22, pVVar13->typeID != 4)) {
        uVar22 = 3;
        goto LAB_001a25b5;
      }
    }
    for (; uVar22 < (pVVar25->arguments).count; uVar22 = uVar22 + 1) {
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,uVar22);
      pVVar15 = *ppVVar11;
      if ((((pVVar15 != (VmValue *)0x0) && (pVVar15->typeID == 1)) &&
          (pVVar15[1].hasMemoryAccess == true)) &&
         (pVVar17 = anon_unknown.dwarf_11cad6::GetCopyInfo
                              (module,pVVar15,(VmConstant *)0x0,(pVVar15->type).size),
         pVVar17 != (VmInstruction *)0x0)) {
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar17->arguments,2);
        pVVar6 = *ppVVar11;
        if ((pVVar6 != (VmValue *)0x0) && (pVVar6->typeID == 1)) {
          iVar8 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
          pVVar14 = (VmConstant *)CONCAT44(extraout_var_00,iVar8);
          VmConstant::VmConstant
                    (pVVar14,ctx->allocator,pVVar15->type,(pVVar25->super_VmValue).source);
          pVVar14->iValue = *(int *)&pVVar6[1]._vptr_VmValue;
          pVVar4 = (VariableData *)pVVar6[1].comment.end;
          pVVar14->container = pVVar4;
          pVVar14->isReference = true;
          deadStores.data = (VmInstruction **)pVVar14;
          SmallArray<VmConstant_*,_8U>::push_back(&pVVar4->users,(VmConstant **)&deadStores);
          pVVar17 = (VmInstruction *)(pVVar15->comment).end;
          deadStores.data[5] = (VmInstruction *)(pVVar15->comment).begin;
          deadStores.data[6] = pVVar17;
          VmValue::AddUse((VmValue *)deadStores.data,&pVVar25->super_VmValue);
          ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,uVar22);
          VmValue::RemoveUse(*ppVVar11,&pVVar25->super_VmValue);
          ppVVar12 = deadStores.data;
          ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,uVar22);
          *ppVVar11 = (VmValue *)ppVVar12;
        }
      }
    }
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,uVar26 - 1);
    pVVar15 = *ppVVar11;
    if (((pVVar15 != (VmValue *)0x0) && (pVVar15->typeID == 1)) &&
       (pVVar15[1].hasMemoryAccess == true)) {
      anon_unknown.dwarf_11cad6::ClearLoadStoreInfo
                (module,(VariableData *)pVVar15[1].comment.end,*(uint *)&pVVar15[1]._vptr_VmValue,
                 (pVVar15->type).size);
    }
    if ((pVVar13 == (VmValue *)0x0) || ((*(byte *)((long)pVVar13[1]._vptr_VmValue + 0x14) & 1) == 0)
       ) {
switchD_001a1ecb_caseD_1a:
      anon_unknown.dwarf_11cad6::ClearLoadStoreInfoAliasing(module,(VmInstruction *)0x0);
      anon_unknown.dwarf_11cad6::ClearLoadStoreInfoGlobal(module);
    }
    goto switchD_001a1ecb_caseD_7;
  case VM_INST_RETURN:
    if ((pVVar25->arguments).count != 0) {
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar25->arguments,0);
      pVVar13 = *ppVVar11;
      if ((((pVVar13 != (VmValue *)0x0) && (pVVar13->typeID == 1)) &&
          (pVVar13[1].hasMemoryAccess == true)) &&
         (pVVar17 = anon_unknown.dwarf_11cad6::GetCopyInfo
                              (module,pVVar13,(VmConstant *)0x0,(pVVar13->type).size),
         pVVar17 != (VmInstruction *)0x0)) {
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar17->arguments,2);
        pVVar15 = *ppVVar11;
        if ((pVVar15 != (VmValue *)0x0) && (pVVar15->typeID == 1)) {
          iVar8 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
          pVVar14 = (VmConstant *)CONCAT44(extraout_var,iVar8);
          VmConstant::VmConstant
                    (pVVar14,ctx->allocator,pVVar13->type,(pVVar25->super_VmValue).source);
          pVVar14->iValue = *(int *)&pVVar15[1]._vptr_VmValue;
          pVVar4 = (VariableData *)pVVar15[1].comment.end;
          pVVar14->container = pVVar4;
          pVVar14->isReference = true;
          deadStores.data = (VmInstruction **)pVVar14;
          SmallArray<VmConstant_*,_8U>::push_back(&pVVar4->users,(VmConstant **)&deadStores);
          in_R9 = (VmValue *)0x0;
          anon_unknown.dwarf_11cad6::ChangeInstructionTo
                    (module,pVVar25,pVVar25->cmd,(VmValue *)deadStores.data,(VmValue *)0x0,
                     (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,puVar1);
        }
      }
    }
    goto switchD_001a1ecb_caseD_7;
  case VM_INST_ADD_LOAD:
  case VM_INST_SUB_LOAD:
  case VM_INST_MUL_LOAD:
  case VM_INST_DIV_LOAD:
  case VM_INST_POW_LOAD:
  case VM_INST_MOD_LOAD:
  case VM_INST_LESS_LOAD:
  case VM_INST_GREATER_LOAD:
  case VM_INST_LESS_EQUAL_LOAD:
  case VM_INST_GREATER_EQUAL_LOAD:
  case VM_INST_EQUAL_LOAD:
  case VM_INST_NOT_EQUAL_LOAD:
  case VM_INST_SHL_LOAD:
  case VM_INST_SHR_LOAD:
  case VM_INST_BIT_AND_LOAD:
  case VM_INST_BIT_OR_LOAD:
  case VM_INST_BIT_XOR_LOAD:
    pSVar19 = &pVVar25->arguments;
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,1);
    pVVar13 = *ppVVar11;
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,2);
    pVVar14 = (VmConstant *)*ppVVar11;
    if ((pVVar14 == (VmConstant *)0x0) || ((pVVar14->super_VmValue).typeID != 1)) {
      pVVar14 = (VmConstant *)0x0;
    }
    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,3);
    pVVar15 = *ppVVar11;
    uVar22 = *(int *)&pVVar15[1]._vptr_VmValue - 2;
    if (3 < uVar22) {
      __assert_fail("loadSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x15aa,
                    "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)");
    }
    uVar22 = *(uint *)(&DAT_001f2680 + (ulong)uVar22 * 4);
    uVar26 = GetAccessSize(pVVar25);
    VVar3 = *(VmInstructionType *)&pVVar15[1]._vptr_VmValue;
    in_R9 = (VmValue *)(ulong)VVar3;
    pVVar13 = anon_unknown.dwarf_11cad6::GetLoadStoreInfo
                        (module,pVVar13,pVVar14,uVar22,uVar26,VVar3);
    if (pVVar13 != (VmValue *)0x0) {
      VVar3 = pVVar25->cmd;
      if (0x10 < VVar3 - VM_INST_ADD_LOAD) {
        __assert_fail("!\"unknown operation\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x10d,
                      "VmInstructionType (anonymous namespace)::GetOperationWithoutLoad(VmInstructionType)"
                     );
      }
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,0);
      in_R9 = (VmValue *)0x0;
      anon_unknown.dwarf_11cad6::ChangeInstructionTo
                (module,pVVar25,VVar3 - VM_INST_DOUBLE_TO_FLOAT,*ppVVar11,pVVar13,(VmValue *)0x0,
                 (VmValue *)0x0,(VmValue *)0x0,puVar1);
    }
    goto switchD_001a1ecb_caseD_7;
  }
  pVVar14 = CreateConstantInt(allocator,pSVar23,iVar8);
LAB_001a20f6:
  anon_unknown.dwarf_11cad6::ReplaceValueUsersWith
            (module,&pVVar25->super_VmValue,&pVVar14->super_VmValue,puVar1);
  goto switchD_001a1ecb_caseD_7;
LAB_001a28ff:
  pVVar5 = *ppVVar12;
  if (pVVar5 == (VmInstruction *)0x0) {
    pVVar5 = (VmInstruction *)*ppcVar2;
LAB_001a2a49:
    do {
      do {
        do {
          pVVar25 = pVVar5;
          if (pVVar25 == (VmInstruction *)0x0) {
            return;
          }
          pVVar5 = pVVar25->nextSibling;
        } while (4 < pVVar25->cmd - VM_INST_LOAD_INT);
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar25->arguments,0);
        pVVar13 = *ppVVar11;
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar25->arguments,1);
        pVVar15 = *ppVVar11;
        if ((pVVar15 == (VmValue *)0x0) || (pVVar15->typeID != 1)) {
          pVVar15 = (VmValue *)0x0;
        }
        pVVar17 = pVVar25;
      } while (((pVVar13 != (VmValue *)0x0) && (pVVar13->typeID == 1)) &&
              (pVVar13[1].comment.end == (char *)0x0));
      do {
        pVVar17 = pVVar17->prevSibling;
        if (pVVar17 == (VmInstruction *)0x0) goto LAB_001a2a49;
        VVar3 = pVVar17->cmd;
        bVar7 = anon_unknown.dwarf_11cad6::HasMemoryAccess(VVar3);
      } while (!bVar7);
      if (VVar3 - VM_INST_STORE_INT < 5) {
        pSVar19 = &pVVar17->arguments;
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,0);
        pVVar6 = *ppVVar11;
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,1);
        pVVar18 = *ppVVar11;
        if ((pVVar18 == (VmValue *)0x0) || (pVVar18->typeID != 1)) {
          pVVar18 = (VmValue *)0x0;
        }
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,2);
        replacement = *ppVVar11;
        uVar22 = GetAccessSize(pVVar17);
        uVar26 = GetAccessSize(pVVar25);
        if (((uVar22 == uVar26) && (pVVar6 == pVVar13)) &&
           ((*(int *)&pVVar18[1]._vptr_VmValue == *(int *)&pVVar15[1]._vptr_VmValue &&
            ((pVVar25->super_VmValue).type.size == (replacement->type).size)))) {
          if ((pVVar25->super_VmValue).type.type != (replacement->type).type) {
            module->currentBlock = (VmBlock *)value;
            value[1].users.data = (VmValue **)pVVar25->prevSibling;
            type_00.structType = (TypeBase *)replacement;
            type_00._0_8_ = (pVVar25->super_VmValue).type.structType;
            replacement = anon_unknown.dwarf_11cad6::CreateBitcast
                                    ((anon_unknown_dwarf_11cad6 *)module,
                                     (VmModule *)(pVVar25->super_VmValue).source,
                                     *(SynBase **)&(pVVar25->super_VmValue).type,type_00,in_R9);
            value[1].users.data = *(VmValue ***)&value[1].hasSideEffects;
            module->currentBlock = (VmBlock *)0x0;
          }
          anon_unknown.dwarf_11cad6::ReplaceValueUsersWith
                    (module,&pVVar25->super_VmValue,replacement,puVar1);
        }
      }
    } while( true );
  }
  VVar3 = pVVar5->cmd;
  pVVar25 = pVVar5;
  if (VVar3 - VM_INST_STORE_BYTE < 7) {
    do {
      pVVar25 = pVVar25->prevSibling;
      if (pVVar25 == (VmInstruction *)0x0) goto LAB_001a2a35;
      cmd = pVVar25->cmd;
      bVar7 = anon_unknown.dwarf_11cad6::HasMemoryAccess(cmd);
    } while (!bVar7);
    if (cmd == VVar3) {
      pSVar19 = &pVVar25->arguments;
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,0);
      pVVar14 = (VmConstant *)*ppVVar11;
      if ((pVVar14 == (VmConstant *)0x0) || ((pVVar14->super_VmValue).typeID != 1)) {
        pVVar14 = (VmConstant *)0x0;
      }
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,1);
      pVVar13 = *ppVVar11;
      if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 1)) {
        pVVar13 = (VmValue *)0x0;
      }
      this = &pVVar5->arguments;
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](this,0);
      this_01 = (VmConstant *)*ppVVar11;
      if ((this_01 == (VmConstant *)0x0) || ((this_01->super_VmValue).typeID != 1)) {
        this_01 = (VmConstant *)0x0;
      }
      ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](this,1);
      pVVar15 = *ppVVar11;
      if ((pVVar15 == (VmValue *)0x0) || (pVVar15->typeID != 1)) {
        pVVar15 = (VmValue *)0x0;
      }
      if ((pVVar14 == (VmConstant *)0x0) || (this_01 == (VmConstant *)0x0)) {
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](pSVar19,0);
        pVVar6 = *ppVVar11;
        ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](this,0);
        if (pVVar6 == *ppVVar11) goto LAB_001a2a0d;
      }
      else {
        bVar7 = VmConstant::operator==(this_01,pVVar14);
        if (bVar7) {
LAB_001a2a0d:
          if (*(int *)&pVVar13[1]._vptr_VmValue == *(int *)&pVVar15[1]._vptr_VmValue) {
            VmBlock::RemoveInstruction((VmBlock *)value,pVVar25);
            *puVar1 = *puVar1 + 1;
          }
        }
      }
    }
  }
LAB_001a2a35:
  ppVVar12 = &pVVar5->nextSibling;
  goto LAB_001a28ff;
}

Assistant:

void RunLoadStorePropagation(ExpressionContext &ctx, VmModule *module, VmValue *value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunLoadStorePropagation(ctx, module, curr);
			curr = next;
		}

		// Remove allocas that are only used by stores
		for(unsigned i = 0; i < function->allocas.size(); i++)
		{
			VariableData *variable = function->allocas[i];

			bool nonStoreUse = false;

			for(unsigned k = 0; k < variable->users.size(); k++)
			{
				VmConstant *user = variable->users[k];

				for(unsigned l = 0; l < user->users.size(); l++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[l]))
					{
						if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
							continue;

						if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[0] == user)
							continue;

						if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[2] == user)
						{
							if(VmConstant *dst = getType<VmConstant>(inst->arguments[0]))
							{
								// Copy to the same container the load is from is a circular use and doesn't count as non-store use
								if(dst->container == user->container)
									continue;
							}
						}

						if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
							continue;

						nonStoreUse = true;
						break;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}

				if(nonStoreUse)
					break;
			}

			if(!nonStoreUse)
			{
				SmallArray<VmInstruction*, 32> deadStores(module->allocator);

				for(unsigned k = 0; k < variable->users.size(); k++)
				{
					VmConstant *user = variable->users[k];

					for(unsigned l = 0; l < user->users.size(); l++)
					{
						if(VmInstruction *inst = getType<VmInstruction>(user->users[l]))
							deadStores.push_back(inst);
					}
				}

				for(unsigned k = 0; k < deadStores.size(); k++)
				{
					VmInstruction *inst = deadStores[k];

					if(inst->parent)
						inst->parent->RemoveInstruction(inst);

					module->loadStorePropagations++;
				}
			}
		}

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		// Handle loads and stores to constant global or frame addresses
		ClearLoadStoreInfo(module);

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			switch(curr->cmd)
			{
			case VM_INST_LOAD_BYTE:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(VmConstant* constant = getType<VmConstant>(prevValue))
					{
						ReplaceValueUsersWith(module, curr, CreateConstantInt(module->allocator, prevValue->source, (int)(char)(constant->iValue)), &module->loadStorePropagations);
						break;
					}
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_LOAD_SHORT:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(VmConstant* constant = getType<VmConstant>(prevValue))
					{
						ReplaceValueUsersWith(module, curr, CreateConstantInt(module->allocator, prevValue->source, (int)(short)(constant->iValue)), &module->loadStorePropagations);
						break;
					}
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
			case VM_INST_LOAD_STRUCT:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(curr->type != prevValue->type)
					{
						assert(curr->type.size == prevValue->type.size);

						module->currentBlock = block;

						block->insertPoint = curr->prevSibling;

						prevValue = CreateBitcast(module, curr->source, curr->type, prevValue);

						block->insertPoint = block->lastInstruction;

						module->currentBlock = NULL;

						ReplaceValueUsersWith(module, curr, prevValue, &module->loadStorePropagations);
					}
					else
					{
						ReplaceValueUsersWith(module, curr, prevValue, &module->loadStorePropagations);
					}

					break;
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_STORE_BYTE:
			case VM_INST_STORE_SHORT:
			case VM_INST_STORE_INT:
			case VM_INST_STORE_FLOAT:
			case VM_INST_STORE_DOUBLE:
			case VM_INST_STORE_LONG:
			case VM_INST_STORE_STRUCT:
				AddStoreInfo(module, curr);
				break;
			case VM_INST_MEM_COPY:
				{
					VmValue *address = curr->arguments[2];
					VmConstant *offset = getType<VmConstant>(curr->arguments[3]);

					if(VmInstruction* prevCopy = GetCopyInfo(module, address, offset, GetAccessSize(curr)))
					{
						ChangeInstructionTo(module, curr, curr->cmd, curr->arguments[0], curr->arguments[1], prevCopy->arguments[2], prevCopy->arguments[3], curr->arguments[4], &module->loadStorePropagations);
					}
				}

				AddCopyInfo(module, curr);
				break;
			case VM_INST_SET_RANGE:
				ClearLoadStoreInfoAliasing(module, NULL);
				ClearLoadStoreInfoGlobal(module);
				break;
			case VM_INST_CALL:
				unsigned firstArgument;
				VmFunction *targetFunction;

				if(curr->arguments[0]->type.type == VM_TYPE_FUNCTION_REF)
				{
					firstArgument = 2;

					targetFunction = NULL;
				}
				else
				{
					firstArgument = 3;

					targetFunction = getType<VmFunction>(curr->arguments[1]);
				}

				for(unsigned i = firstArgument; i < curr->arguments.size(); i++)
				{
					if(VmConstant *constant = getType<VmConstant>(curr->arguments[i]))
					{
						if(constant->isReference)
						{
							if(VmInstruction* prevCopy = GetCopyInfo(module, constant, NULL, constant->type.size))
							{
								if(VmConstant *constAddress = getType<VmConstant>(prevCopy->arguments[2]))
								{
									VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, constant->type, curr->source);

									reference->iValue = constAddress->iValue;
									reference->container = constAddress->container;
									reference->isReference = true;

									reference->container->users.push_back(reference);

									reference->comment = constant->comment;

									reference->AddUse(curr);
									curr->arguments[i]->RemoveUse(curr);

									curr->arguments[i] = reference;
								}
							}
						}
					}
				}

				if(VmConstant *constant = getType<VmConstant>(curr->arguments[firstArgument - 1]))
				{
					if(constant->isReference)
					{
						// Remove previous loads and stores to the address range of the return value
						ClearLoadStoreInfo(module, constant->container, unsigned(constant->iValue), constant->type.size);
					}
				}

				if(targetFunction)
				{
					if((targetFunction->function->attributes & (1 << NULLC_ATTRIBUTE_NO_MEMORY_WRITE)) != 0)
						break;
				}

				ClearLoadStoreInfoAliasing(module, NULL);
				ClearLoadStoreInfoGlobal(module);
				break;
			case VM_INST_RETURN:
				if(!curr->arguments.empty())
				{
					if(VmConstant *constant = getType<VmConstant>(curr->arguments[0]))
					{
						if(constant->isReference)
						{
							if(VmInstruction* prevCopy = GetCopyInfo(module, constant, NULL, constant->type.size))
							{
								if(VmConstant *constAddress = getType<VmConstant>(prevCopy->arguments[2]))
								{
									VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, constant->type, curr->source);

									reference->iValue = constAddress->iValue;
									reference->container = constAddress->container;
									reference->isReference = true;

									reference->container->users.push_back(reference);

									ChangeInstructionTo(module, curr, curr->cmd, reference, NULL, NULL, NULL, NULL, &module->loadStorePropagations);
								}
							}
						}
					}
				}
				break;
			case VM_INST_ADD_LOAD:
			case VM_INST_SUB_LOAD:
			case VM_INST_MUL_LOAD:
			case VM_INST_DIV_LOAD:
			case VM_INST_POW_LOAD:
			case VM_INST_MOD_LOAD:
			case VM_INST_LESS_LOAD:
			case VM_INST_GREATER_LOAD:
			case VM_INST_LESS_EQUAL_LOAD:
			case VM_INST_GREATER_EQUAL_LOAD:
			case VM_INST_EQUAL_LOAD:
			case VM_INST_NOT_EQUAL_LOAD:
			case VM_INST_SHL_LOAD:
			case VM_INST_SHR_LOAD:
			case VM_INST_BIT_AND_LOAD:
			case VM_INST_BIT_OR_LOAD:
			case VM_INST_BIT_XOR_LOAD:
			{
				VmValue *loadPointer = curr->arguments[1];
				VmConstant *loadOffset = getType<VmConstant>(curr->arguments[2]);
				VmConstant *loadInst = getType<VmConstant>(curr->arguments[3]);

				unsigned loadSize = 0;

				switch(loadInst->iValue)
				{
				case VM_INST_LOAD_INT:
				case VM_INST_LOAD_FLOAT:
					loadSize = 4;
					break;
				case VM_INST_LOAD_DOUBLE:
				case VM_INST_LOAD_LONG:
					loadSize = 8;
					break;
				}

				assert(loadSize);

				unsigned accessSize = GetAccessSize(curr);

				if(VmValue* prevValue = GetLoadStoreInfo(module, loadPointer, loadOffset, loadSize, accessSize, VmInstructionType(loadInst->iValue)))
					ChangeInstructionTo(module, curr, GetOperationWithoutLoad(curr->cmd), curr->arguments[0], prevValue, NULL, NULL, NULL, &module->loadStorePropagations);
			}
				break;
			default:
				break;
			}

			curr = next;
		}

		// Handle consecutive stores to the same address
		for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
		{
			if(curr->cmd >= VM_INST_STORE_BYTE && curr->cmd <= VM_INST_STORE_STRUCT)
			{
				// Walk up until a memory write is reached
				VmInstruction *prev = curr->prevSibling;

				while(prev && !HasMemoryAccess(prev->cmd))
					prev = prev->prevSibling;

				if(prev && prev->cmd == curr->cmd)
				{
					bool same = false;

					VmConstant *prevAddressAsConst = getType<VmConstant>(prev->arguments[0]);
					VmConstant *prevOffset = getType<VmConstant>(prev->arguments[1]);

					VmConstant *currAddressAsConst = getType<VmConstant>(curr->arguments[0]);
					VmConstant *currOffset = getType<VmConstant>(curr->arguments[1]);

					if(currAddressAsConst && prevAddressAsConst)
						same = *currAddressAsConst == *prevAddressAsConst && prevOffset->iValue == currOffset->iValue;
					else
						same = prev->arguments[0] == curr->arguments[0] && prevOffset->iValue == currOffset->iValue;

					if(same)
					{
						block->RemoveInstruction(prev);

						module->loadStorePropagations++;
					}
				}
			}
		}

		// Handle immediate loads from the same address as a store
		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd >= VM_INST_LOAD_INT && curr->cmd <= VM_INST_LOAD_STRUCT)
			{
				VmValue *loadPointer = curr->arguments[0];
				VmConstant *loadOffset = getType<VmConstant>(curr->arguments[1]);

				// Skip reads of direct addresses (usually from null pointer access)
				if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
				{
					if(!loadAddress->container)
					{
						curr = next;
						continue;
					}
				}

				// Walk up until a memory write is reached
				VmInstruction *prev = curr->prevSibling;

				while(prev && !HasMemoryAccess(prev->cmd))
					prev = prev->prevSibling;

				if(prev && (prev->cmd >= VM_INST_STORE_INT && prev->cmd <= VM_INST_STORE_STRUCT))
				{
					VmValue *storePointer = prev->arguments[0];
					VmConstant *storeOffset = getType<VmConstant>(prev->arguments[1]);
					VmValue *storeValue = prev->arguments[2];

					if(GetAccessSize(prev) == GetAccessSize(curr) && storePointer == loadPointer && storeOffset->iValue == loadOffset->iValue && curr->type.size == storeValue->type.size)
					{
						if(curr->type != storeValue->type)
						{
							module->currentBlock = block;

							block->insertPoint = curr->prevSibling;

							storeValue = CreateBitcast(module, curr->source, curr->type, storeValue);

							block->insertPoint = block->lastInstruction;

							module->currentBlock = NULL;

							ReplaceValueUsersWith(module, curr, storeValue, &module->loadStorePropagations);
						}
						else
						{
							ReplaceValueUsersWith(module, curr, storeValue, &module->loadStorePropagations);
						}
					}
				}
			}

			curr = next;
		}
	}
}